

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP5Deserializer::InstallAttributesV1
          (BP5Deserializer *this,FFSTypeHandle FFSformat,void *BaseData,size_t Step)

{
  string *psVar1;
  bool bVar2;
  DataType DVar3;
  DataType DVar4;
  DataType DVar5;
  undefined8 uVar6;
  ostream *poVar7;
  char *pcVar8;
  reference pvVar9;
  long in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  complex<double> **array_14;
  complex<float> **array_13;
  longdouble **array_12;
  double **array_11;
  float **array_10;
  uint64_t **array_9;
  uint32_t **array_8;
  uint16_t **array_7;
  uint8_t **array_6;
  int64_t **array_5;
  int32_t **array_4;
  int16_t **array_3;
  int8_t **array_2;
  char **array_1;
  size_t i_1;
  char **str_array;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  array;
  char *FieldType;
  char *FieldName_1;
  size_t ElemCount;
  DataType Type_1;
  char *FieldName;
  int ElemSize;
  DataType Type;
  void *field_data;
  int i;
  FMStructDescList FormatList;
  FMFieldList FieldList;
  undefined4 in_stack_ffffffffffffe908;
  int in_stack_ffffffffffffe90c;
  BP5Deserializer *in_stack_ffffffffffffe910;
  BP5Deserializer *in_stack_ffffffffffffe918;
  IO *in_stack_ffffffffffffe920;
  ostream *in_stack_ffffffffffffe928;
  BP5Deserializer *in_stack_ffffffffffffe930;
  _Base_ptr in_stack_ffffffffffffe9b8;
  ulong *in_stack_ffffffffffffed58;
  string *in_stack_ffffffffffffed60;
  string *in_stack_ffffffffffffed68;
  string *in_stack_ffffffffffffed70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffed78;
  undefined4 in_stack_ffffffffffffed80;
  DataType in_stack_ffffffffffffed84;
  IO *in_stack_ffffffffffffed88;
  undefined1 local_f90 [39];
  undefined1 local_f69 [40];
  allocator local_f41;
  string local_f40 [39];
  allocator local_f19;
  string local_f18 [32];
  pointer local_ef8;
  allocator local_ee9;
  string local_ee8 [39];
  allocator local_ec1;
  string local_ec0 [39];
  allocator local_e99;
  string local_e98 [32];
  __buckets_ptr local_e78;
  allocator local_e69;
  string local_e68 [39];
  allocator local_e41;
  string local_e40 [39];
  allocator local_e19;
  string local_e18 [32];
  _Base_ptr local_df8;
  allocator local_de9;
  string local_de8 [39];
  allocator local_dc1;
  string local_dc0 [39];
  allocator local_d99;
  string local_d98 [32];
  ulong local_d78;
  allocator local_d69;
  string local_d68 [39];
  allocator local_d41;
  string local_d40 [39];
  allocator local_d19;
  string local_d18 [32];
  ulong local_cf8;
  allocator local_ce9;
  string local_ce8 [39];
  allocator local_cc1;
  string local_cc0 [39];
  allocator local_c99;
  string local_c98 [32];
  ulong local_c78;
  allocator local_c69;
  string local_c68 [39];
  allocator local_c41;
  string local_c40 [39];
  allocator local_c19;
  string local_c18 [32];
  ulong local_bf8;
  allocator local_be9;
  string local_be8 [39];
  allocator local_bc1;
  string local_bc0 [39];
  allocator local_b99;
  string local_b98 [32];
  ulong local_b78;
  allocator local_b69;
  string local_b68 [39];
  allocator local_b41;
  string local_b40 [39];
  allocator local_b19;
  string local_b18 [32];
  ulong local_af8;
  allocator local_ae9;
  string local_ae8 [39];
  allocator local_ac1;
  string local_ac0 [39];
  allocator local_a99;
  string local_a98 [32];
  ulong local_a78;
  allocator local_a69;
  string local_a68 [39];
  allocator local_a41;
  string local_a40 [39];
  allocator local_a19;
  string local_a18 [32];
  ulong local_9f8;
  allocator local_9e9;
  string local_9e8 [39];
  allocator local_9c1;
  string local_9c0 [39];
  allocator local_999;
  string local_998 [32];
  ulong local_978;
  allocator local_969;
  string local_968 [39];
  allocator local_941;
  string local_940 [39];
  allocator local_919;
  string local_918 [32];
  ulong local_8f8;
  allocator local_8e9;
  string local_8e8 [39];
  allocator local_8c1;
  string local_8c0 [39];
  allocator local_899;
  string local_898 [32];
  ulong local_878;
  allocator local_869;
  string local_868 [39];
  allocator local_841;
  string local_840 [39];
  allocator local_819;
  string local_818 [32];
  size_type local_7f8;
  ulong local_7f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7e8;
  char *local_7d0;
  char *local_7c8;
  ulong local_7c0;
  DataType local_7b4;
  string local_7b0 [39];
  allocator local_789;
  string local_788 [39];
  allocator local_761;
  string local_760 [39];
  allocator local_739;
  string local_738 [39];
  allocator local_711;
  string local_710 [39];
  undefined1 local_6e9 [40];
  undefined1 local_6c1 [40];
  undefined1 local_699 [40];
  allocator local_671;
  string local_670 [39];
  allocator local_649;
  string local_648 [39];
  allocator local_621;
  string local_620 [39];
  allocator local_5f9;
  string local_5f8 [39];
  allocator local_5d1;
  string local_5d0 [39];
  allocator local_5a9;
  string local_5a8 [39];
  allocator local_581;
  string local_580 [39];
  allocator local_559;
  string local_558 [39];
  allocator local_531;
  string local_530 [39];
  allocator local_509;
  string local_508 [39];
  allocator local_4e1;
  string local_4e0 [39];
  allocator local_4b9;
  string local_4b8 [39];
  allocator local_491;
  string local_490 [39];
  allocator local_469;
  string local_468 [39];
  allocator local_441;
  string local_440 [39];
  allocator local_419;
  string local_418 [39];
  allocator local_3f1;
  string local_3f0 [39];
  allocator local_3c9;
  string local_3c8 [39];
  allocator local_3a1;
  string local_3a0 [39];
  allocator local_379;
  string local_378 [39];
  allocator local_351;
  string local_350 [39];
  allocator local_329;
  string local_328 [39];
  allocator local_301;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [39];
  allocator local_289;
  string local_288 [39];
  allocator local_261;
  string local_260 [39];
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [55];
  allocator local_71;
  string local_70 [32];
  string *local_50;
  DataType local_44;
  ulong *local_40;
  int local_34;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RCX != *(long *)(in_RDI + 0x68)) {
    local_20 = in_RCX;
    core::IO::RemoveAllAttributes(in_stack_ffffffffffffe920);
    *(long *)(in_RDI + 0x68) = local_20;
  }
  uVar6 = FMFormat_of_original(local_10);
  local_30 = format_list_of_FMFormat(uVar6);
  local_28 = *(long *)(local_30 + 8);
  local_34 = 0;
  do {
    if (*(long *)(local_28 + (long)local_34 * 0x18) == 0) {
      return;
    }
    local_40 = (ulong *)(local_18 + *(int *)(local_28 + (long)local_34 * 0x18 + 0x14));
    bVar2 = NameIndicatesAttrArray
                      (in_stack_ffffffffffffe910,
                       (char *)CONCAT44(in_stack_ffffffffffffe90c,in_stack_ffffffffffffe908));
    if (bVar2) {
      local_7c0 = *local_40;
      local_40 = local_40 + 1;
      local_34 = local_34 + 1;
      local_7c8 = strdup((char *)(*(long *)(local_28 + (long)local_34 * 0x18) + 4));
      local_7d0 = strdup(*(char **)(local_28 + (long)local_34 * 0x18 + 8));
      pcVar8 = strchr(local_7d0,0x5b);
      *pcVar8 = '\0';
      DVar5 = TranslateFFSType2ADIOS
                        (in_stack_ffffffffffffe918,(char *)in_stack_ffffffffffffe910,
                         in_stack_ffffffffffffe90c);
      if (DVar5 == Struct) {
        return;
      }
      local_7b4 = DVar5;
      DVar3 = helper::GetDataType<std::__cxx11::string>();
      DVar4 = local_7b4;
      if (DVar5 == DVar3) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0xcfa393);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffe930,(size_type)in_stack_ffffffffffffe928);
        local_7f0 = *local_40;
        for (local_7f8 = 0; pcVar8 = local_7c8, local_7f8 < local_7c0; local_7f8 = local_7f8 + 1) {
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&local_7e8,local_7f8);
          std::__cxx11::string::assign((char *)pvVar9);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_818,pcVar8,&local_819);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::data((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0xcfa4b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::size(&local_7e8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_840,"",&local_841);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_868,"/",&local_869);
        in_stack_ffffffffffffe908 = 1;
        core::IO::DefineAttribute<std::__cxx11::string>
                  (in_stack_ffffffffffffed88,
                   (string *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
                   in_stack_ffffffffffffed78,(size_t)in_stack_ffffffffffffed70,
                   in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,
                   SUB81((ulong)in_stack_ffffffffffffed58 >> 0x38,0));
        std::__cxx11::string::~string(local_868);
        std::allocator<char>::~allocator((allocator<char> *)&local_869);
        std::__cxx11::string::~string(local_840);
        std::allocator<char>::~allocator((allocator<char> *)&local_841);
        std::__cxx11::string::~string(local_818);
        std::allocator<char>::~allocator((allocator<char> *)&local_819);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffe920);
      }
      else {
        DVar3 = helper::GetDataType<char>();
        DVar5 = local_7b4;
        pcVar8 = local_7c8;
        if (DVar4 == DVar3) {
          local_878 = *local_40;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_898,pcVar8,&local_899);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_8c0,"",&local_8c1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_8e8,"/",&local_8e9);
          in_stack_ffffffffffffe908 = 1;
          core::IO::DefineAttribute<char>
                    (in_stack_ffffffffffffed88,
                     (string *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
                     (char *)in_stack_ffffffffffffed78,(size_t)in_stack_ffffffffffffed70,
                     in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,
                     SUB81((ulong)in_stack_ffffffffffffed58 >> 0x38,0));
          std::__cxx11::string::~string(local_8e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
          std::__cxx11::string::~string(local_8c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
          std::__cxx11::string::~string(local_898);
          std::allocator<char>::~allocator((allocator<char> *)&local_899);
        }
        else {
          DVar3 = helper::GetDataType<signed_char>();
          DVar4 = local_7b4;
          pcVar8 = local_7c8;
          if (DVar5 == DVar3) {
            local_8f8 = *local_40;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_918,pcVar8,&local_919);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_940,"",&local_941);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_968,"/",&local_969);
            in_stack_ffffffffffffe908 = 1;
            core::IO::DefineAttribute<signed_char>
                      (in_stack_ffffffffffffed88,
                       (string *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
                       (char *)in_stack_ffffffffffffed78,(size_t)in_stack_ffffffffffffed70,
                       in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,
                       SUB81((ulong)in_stack_ffffffffffffed58 >> 0x38,0));
            std::__cxx11::string::~string(local_968);
            std::allocator<char>::~allocator((allocator<char> *)&local_969);
            std::__cxx11::string::~string(local_940);
            std::allocator<char>::~allocator((allocator<char> *)&local_941);
            std::__cxx11::string::~string(local_918);
            std::allocator<char>::~allocator((allocator<char> *)&local_919);
          }
          else {
            DVar3 = helper::GetDataType<short>();
            DVar5 = local_7b4;
            pcVar8 = local_7c8;
            if (DVar4 == DVar3) {
              local_978 = *local_40;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_998,pcVar8,&local_999);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_9c0,"",&local_9c1);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_9e8,"/",&local_9e9);
              in_stack_ffffffffffffe908 = 1;
              core::IO::DefineAttribute<short>
                        (in_stack_ffffffffffffed88,
                         (string *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
                         (short *)in_stack_ffffffffffffed78,(size_t)in_stack_ffffffffffffed70,
                         in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,
                         SUB81((ulong)in_stack_ffffffffffffed58 >> 0x38,0));
              std::__cxx11::string::~string(local_9e8);
              std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
              std::__cxx11::string::~string(local_9c0);
              std::allocator<char>::~allocator((allocator<char> *)&local_9c1);
              std::__cxx11::string::~string(local_998);
              std::allocator<char>::~allocator((allocator<char> *)&local_999);
            }
            else {
              DVar3 = helper::GetDataType<int>();
              DVar4 = local_7b4;
              pcVar8 = local_7c8;
              if (DVar5 == DVar3) {
                local_9f8 = *local_40;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_a18,pcVar8,&local_a19);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_a40,"",&local_a41);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_a68,"/",&local_a69);
                in_stack_ffffffffffffe908 = 1;
                core::IO::DefineAttribute<int>
                          (in_stack_ffffffffffffed88,
                           (string *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
                           (int *)in_stack_ffffffffffffed78,(size_t)in_stack_ffffffffffffed70,
                           in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,
                           SUB81((ulong)in_stack_ffffffffffffed58 >> 0x38,0));
                std::__cxx11::string::~string(local_a68);
                std::allocator<char>::~allocator((allocator<char> *)&local_a69);
                std::__cxx11::string::~string(local_a40);
                std::allocator<char>::~allocator((allocator<char> *)&local_a41);
                std::__cxx11::string::~string(local_a18);
                std::allocator<char>::~allocator((allocator<char> *)&local_a19);
              }
              else {
                DVar3 = helper::GetDataType<long>();
                DVar5 = local_7b4;
                pcVar8 = local_7c8;
                if (DVar4 == DVar3) {
                  local_a78 = *local_40;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_a98,pcVar8,&local_a99);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_ac0,"",&local_ac1);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_ae8,"/",&local_ae9);
                  in_stack_ffffffffffffe908 = 1;
                  core::IO::DefineAttribute<long>
                            (in_stack_ffffffffffffed88,
                             (string *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80)
                             ,(long *)in_stack_ffffffffffffed78,(size_t)in_stack_ffffffffffffed70,
                             in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,
                             SUB81((ulong)in_stack_ffffffffffffed58 >> 0x38,0));
                  std::__cxx11::string::~string(local_ae8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_ae9);
                  std::__cxx11::string::~string(local_ac0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_ac1);
                  std::__cxx11::string::~string(local_a98);
                  std::allocator<char>::~allocator((allocator<char> *)&local_a99);
                }
                else {
                  DVar3 = helper::GetDataType<unsigned_char>();
                  DVar4 = local_7b4;
                  pcVar8 = local_7c8;
                  if (DVar5 == DVar3) {
                    local_af8 = *local_40;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_b18,pcVar8,&local_b19);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_b40,"",&local_b41);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_b68,"/",&local_b69);
                    in_stack_ffffffffffffe908 = 1;
                    core::IO::DefineAttribute<unsigned_char>
                              (in_stack_ffffffffffffed88,
                               (string *)
                               CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
                               (uchar *)in_stack_ffffffffffffed78,(size_t)in_stack_ffffffffffffed70,
                               in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,
                               SUB81((ulong)in_stack_ffffffffffffed58 >> 0x38,0));
                    std::__cxx11::string::~string(local_b68);
                    std::allocator<char>::~allocator((allocator<char> *)&local_b69);
                    std::__cxx11::string::~string(local_b40);
                    std::allocator<char>::~allocator((allocator<char> *)&local_b41);
                    std::__cxx11::string::~string(local_b18);
                    std::allocator<char>::~allocator((allocator<char> *)&local_b19);
                  }
                  else {
                    DVar3 = helper::GetDataType<unsigned_short>();
                    DVar5 = local_7b4;
                    pcVar8 = local_7c8;
                    if (DVar4 == DVar3) {
                      local_b78 = *local_40;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_b98,pcVar8,&local_b99);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_bc0,"",&local_bc1);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_be8,"/",&local_be9);
                      in_stack_ffffffffffffe908 = 1;
                      core::IO::DefineAttribute<unsigned_short>
                                (in_stack_ffffffffffffed88,
                                 (string *)
                                 CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
                                 (unsigned_short *)in_stack_ffffffffffffed78,
                                 (size_t)in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,
                                 in_stack_ffffffffffffed60,
                                 SUB81((ulong)in_stack_ffffffffffffed58 >> 0x38,0));
                      std::__cxx11::string::~string(local_be8);
                      std::allocator<char>::~allocator((allocator<char> *)&local_be9);
                      std::__cxx11::string::~string(local_bc0);
                      std::allocator<char>::~allocator((allocator<char> *)&local_bc1);
                      std::__cxx11::string::~string(local_b98);
                      std::allocator<char>::~allocator((allocator<char> *)&local_b99);
                    }
                    else {
                      DVar3 = helper::GetDataType<unsigned_int>();
                      DVar4 = local_7b4;
                      pcVar8 = local_7c8;
                      if (DVar5 == DVar3) {
                        local_bf8 = *local_40;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_c18,pcVar8,&local_c19);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_c40,"",&local_c41);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_c68,"/",&local_c69);
                        in_stack_ffffffffffffe908 = 1;
                        core::IO::DefineAttribute<unsigned_int>
                                  (in_stack_ffffffffffffed88,
                                   (string *)
                                   CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
                                   (uint *)in_stack_ffffffffffffed78,
                                   (size_t)in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,
                                   in_stack_ffffffffffffed60,
                                   SUB81((ulong)in_stack_ffffffffffffed58 >> 0x38,0));
                        std::__cxx11::string::~string(local_c68);
                        std::allocator<char>::~allocator((allocator<char> *)&local_c69);
                        std::__cxx11::string::~string(local_c40);
                        std::allocator<char>::~allocator((allocator<char> *)&local_c41);
                        std::__cxx11::string::~string(local_c18);
                        std::allocator<char>::~allocator((allocator<char> *)&local_c19);
                      }
                      else {
                        DVar3 = helper::GetDataType<unsigned_long>();
                        DVar5 = local_7b4;
                        pcVar8 = local_7c8;
                        if (DVar4 == DVar3) {
                          local_c78 = *local_40;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_c98,pcVar8,&local_c99);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_cc0,"",&local_cc1);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_ce8,"/",&local_ce9);
                          in_stack_ffffffffffffe908 = 1;
                          core::IO::DefineAttribute<unsigned_long>
                                    (in_stack_ffffffffffffed88,
                                     (string *)
                                     CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
                                     (unsigned_long *)in_stack_ffffffffffffed78,
                                     (size_t)in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,
                                     in_stack_ffffffffffffed60,
                                     SUB81((ulong)in_stack_ffffffffffffed58 >> 0x38,0));
                          std::__cxx11::string::~string(local_ce8);
                          std::allocator<char>::~allocator((allocator<char> *)&local_ce9);
                          std::__cxx11::string::~string(local_cc0);
                          std::allocator<char>::~allocator((allocator<char> *)&local_cc1);
                          std::__cxx11::string::~string(local_c98);
                          std::allocator<char>::~allocator((allocator<char> *)&local_c99);
                        }
                        else {
                          DVar3 = helper::GetDataType<float>();
                          DVar4 = local_7b4;
                          pcVar8 = local_7c8;
                          if (DVar5 == DVar3) {
                            local_cf8 = *local_40;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_d18,pcVar8,&local_d19);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_d40,"",&local_d41);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_d68,"/",&local_d69);
                            in_stack_ffffffffffffe908 = 1;
                            core::IO::DefineAttribute<float>
                                      (in_stack_ffffffffffffed88,
                                       (string *)
                                       CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80)
                                       ,(float *)in_stack_ffffffffffffed78,
                                       (size_t)in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,
                                       in_stack_ffffffffffffed60,
                                       SUB81((ulong)in_stack_ffffffffffffed58 >> 0x38,0));
                            std::__cxx11::string::~string(local_d68);
                            std::allocator<char>::~allocator((allocator<char> *)&local_d69);
                            std::__cxx11::string::~string(local_d40);
                            std::allocator<char>::~allocator((allocator<char> *)&local_d41);
                            std::__cxx11::string::~string(local_d18);
                            std::allocator<char>::~allocator((allocator<char> *)&local_d19);
                          }
                          else {
                            DVar3 = helper::GetDataType<double>();
                            DVar5 = local_7b4;
                            pcVar8 = local_7c8;
                            if (DVar4 == DVar3) {
                              local_d78 = *local_40;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_d98,pcVar8,&local_d99);
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_dc0,"",&local_dc1);
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_de8,"/",&local_de9);
                              in_stack_ffffffffffffe908 = 1;
                              core::IO::DefineAttribute<double>
                                        (in_stack_ffffffffffffed88,
                                         (string *)
                                         CONCAT44(in_stack_ffffffffffffed84,
                                                  in_stack_ffffffffffffed80),
                                         (double *)in_stack_ffffffffffffed78,
                                         (size_t)in_stack_ffffffffffffed70,in_stack_ffffffffffffed68
                                         ,in_stack_ffffffffffffed60,
                                         SUB81((ulong)in_stack_ffffffffffffed58 >> 0x38,0));
                              std::__cxx11::string::~string(local_de8);
                              std::allocator<char>::~allocator((allocator<char> *)&local_de9);
                              std::__cxx11::string::~string(local_dc0);
                              std::allocator<char>::~allocator((allocator<char> *)&local_dc1);
                              std::__cxx11::string::~string(local_d98);
                              std::allocator<char>::~allocator((allocator<char> *)&local_d99);
                            }
                            else {
                              DVar3 = helper::GetDataType<long_double>();
                              DVar4 = local_7b4;
                              pcVar8 = local_7c8;
                              if (DVar5 == DVar3) {
                                local_df8 = (_Base_ptr)*local_40;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_e18,pcVar8,&local_e19);
                                in_stack_ffffffffffffe9b8 = local_df8;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_e40,"",&local_e41);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_e68,"/",&local_e69);
                                in_stack_ffffffffffffe908 = 1;
                                core::IO::DefineAttribute<long_double>
                                          (in_stack_ffffffffffffed88,
                                           (string *)
                                           CONCAT44(in_stack_ffffffffffffed84,
                                                    in_stack_ffffffffffffed80),
                                           (longdouble *)in_stack_ffffffffffffed78,
                                           (size_t)in_stack_ffffffffffffed70,
                                           in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,
                                           SUB81((ulong)in_stack_ffffffffffffed58 >> 0x38,0));
                                std::__cxx11::string::~string(local_e68);
                                std::allocator<char>::~allocator((allocator<char> *)&local_e69);
                                std::__cxx11::string::~string(local_e40);
                                std::allocator<char>::~allocator((allocator<char> *)&local_e41);
                                std::__cxx11::string::~string(local_e18);
                                std::allocator<char>::~allocator((allocator<char> *)&local_e19);
                              }
                              else {
                                DVar3 = helper::GetDataType<std::complex<float>>();
                                DVar5 = local_7b4;
                                pcVar8 = local_7c8;
                                if (DVar4 == DVar3) {
                                  local_e78 = (__buckets_ptr)*local_40;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_e98,pcVar8,&local_e99);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_ec0,"",&local_ec1);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_ee8,"/",&local_ee9);
                                  in_stack_ffffffffffffe908 = 1;
                                  core::IO::DefineAttribute<std::complex<float>>
                                            (in_stack_ffffffffffffed88,
                                             (string *)
                                             CONCAT44(in_stack_ffffffffffffed84,
                                                      in_stack_ffffffffffffed80),
                                             (complex<float> *)in_stack_ffffffffffffed78,
                                             (size_t)in_stack_ffffffffffffed70,
                                             in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,
                                             SUB81((ulong)in_stack_ffffffffffffed58 >> 0x38,0));
                                  std::__cxx11::string::~string(local_ee8);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_ee9);
                                  std::__cxx11::string::~string(local_ec0);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_ec1);
                                  std::__cxx11::string::~string(local_e98);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_e99);
                                }
                                else {
                                  DVar4 = helper::GetDataType<std::complex<double>>();
                                  pcVar8 = local_7c8;
                                  if (DVar5 == DVar4) {
                                    local_ef8 = (pointer)*local_40;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string(local_f18,pcVar8,&local_f19);
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string(local_f40,"",&local_f41);
                                    in_stack_ffffffffffffe930 = (BP5Deserializer *)local_f69;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)(local_f69 + 1),"/",
                                               (allocator *)in_stack_ffffffffffffe930);
                                    in_stack_ffffffffffffe908 = 1;
                                    core::IO::DefineAttribute<std::complex<double>>
                                              (in_stack_ffffffffffffed88,
                                               (string *)
                                               CONCAT44(in_stack_ffffffffffffed84,
                                                        in_stack_ffffffffffffed80),
                                               (complex<double> *)in_stack_ffffffffffffed78,
                                               (size_t)in_stack_ffffffffffffed70,
                                               in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,
                                               SUB81((ulong)in_stack_ffffffffffffed58 >> 0x38,0));
                                    std::__cxx11::string::~string((string *)(local_f69 + 1));
                                    std::allocator<char>::~allocator((allocator<char> *)local_f69);
                                    std::__cxx11::string::~string(local_f40);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_f41);
                                    std::__cxx11::string::~string(local_f18);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_f19);
                                  }
                                  else {
                                    in_stack_ffffffffffffe918 =
                                         (BP5Deserializer *)
                                         std::operator<<((ostream *)&std::cout,
                                                         "Loading attribute matched no type ");
                                    in_stack_ffffffffffffe920 = (IO *)local_f90;
                                    ToString_abi_cxx11_((DataType)
                                                        ((ulong)in_stack_ffffffffffffe9b8 >> 0x20));
                                    in_stack_ffffffffffffe928 =
                                         std::operator<<((ostream *)in_stack_ffffffffffffe918,
                                                         (string *)in_stack_ffffffffffffe920);
                                    std::ostream::operator<<
                                              (in_stack_ffffffffffffe928,
                                               std::endl<char,std::char_traits<char>>);
                                    std::__cxx11::string::~string((string *)local_f90);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      free(local_7c8);
    }
    else {
      local_50 = (string *)
                 BreakdownVarName(in_stack_ffffffffffffe930,(char *)in_stack_ffffffffffffe928,
                                  (DataType *)in_stack_ffffffffffffe920,
                                  (int *)in_stack_ffffffffffffe918);
      DVar5 = local_44;
      if (local_44 == Struct) {
        return;
      }
      DVar3 = helper::GetDataType<std::__cxx11::string>();
      DVar4 = local_44;
      psVar1 = local_50;
      if (DVar5 == DVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_70,(char *)psVar1,&local_71);
        pcVar8 = (char *)*local_40;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a8,pcVar8,&local_a9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d0,"",&local_d1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f8,"/",&local_f9);
        core::IO::DefineAttribute<std::__cxx11::string>
                  (in_stack_ffffffffffffed88,
                   (string *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
                   in_stack_ffffffffffffed78,in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,
                   SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
        std::__cxx11::string::~string(local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        std::__cxx11::string::~string(local_70);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
      }
      else {
        DVar3 = helper::GetDataType<char>();
        DVar5 = local_44;
        psVar1 = local_50;
        if (DVar4 == DVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_120,(char *)psVar1,&local_121);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_148,"",&local_149);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_170,"/",&local_171);
          core::IO::DefineAttribute<char>
                    (in_stack_ffffffffffffed88,
                     (string *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
                     (char *)in_stack_ffffffffffffed78,in_stack_ffffffffffffed70,
                     in_stack_ffffffffffffed68,SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
          std::__cxx11::string::~string(local_170);
          std::allocator<char>::~allocator((allocator<char> *)&local_171);
          std::__cxx11::string::~string(local_148);
          std::allocator<char>::~allocator((allocator<char> *)&local_149);
          std::__cxx11::string::~string(local_120);
          std::allocator<char>::~allocator((allocator<char> *)&local_121);
        }
        else {
          DVar3 = helper::GetDataType<signed_char>();
          DVar4 = local_44;
          psVar1 = local_50;
          if (DVar5 == DVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_198,(char *)psVar1,&local_199);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1c0,"",&local_1c1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1e8,"/",&local_1e9);
            core::IO::DefineAttribute<signed_char>
                      (in_stack_ffffffffffffed88,
                       (string *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
                       (char *)in_stack_ffffffffffffed78,in_stack_ffffffffffffed70,
                       in_stack_ffffffffffffed68,SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
            std::__cxx11::string::~string(local_1e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
            std::__cxx11::string::~string(local_1c0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
            std::__cxx11::string::~string(local_198);
            std::allocator<char>::~allocator((allocator<char> *)&local_199);
          }
          else {
            DVar3 = helper::GetDataType<short>();
            DVar5 = local_44;
            psVar1 = local_50;
            if (DVar4 == DVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_210,(char *)psVar1,&local_211);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_238,"",&local_239);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_260,"/",&local_261);
              core::IO::DefineAttribute<short>
                        (in_stack_ffffffffffffed88,
                         (string *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
                         (short *)in_stack_ffffffffffffed78,in_stack_ffffffffffffed70,
                         in_stack_ffffffffffffed68,SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0)
                        );
              std::__cxx11::string::~string(local_260);
              std::allocator<char>::~allocator((allocator<char> *)&local_261);
              std::__cxx11::string::~string(local_238);
              std::allocator<char>::~allocator((allocator<char> *)&local_239);
              std::__cxx11::string::~string(local_210);
              std::allocator<char>::~allocator((allocator<char> *)&local_211);
            }
            else {
              DVar3 = helper::GetDataType<int>();
              DVar4 = local_44;
              psVar1 = local_50;
              if (DVar5 == DVar3) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_288,(char *)psVar1,&local_289);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_2b0,"",&local_2b1);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_2d8,"/",&local_2d9);
                core::IO::DefineAttribute<int>
                          (in_stack_ffffffffffffed88,
                           (string *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
                           (int *)in_stack_ffffffffffffed78,in_stack_ffffffffffffed70,
                           in_stack_ffffffffffffed68,
                           SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
                std::__cxx11::string::~string(local_2d8);
                std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
                std::__cxx11::string::~string(local_2b0);
                std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
                std::__cxx11::string::~string(local_288);
                std::allocator<char>::~allocator((allocator<char> *)&local_289);
              }
              else {
                DVar3 = helper::GetDataType<long>();
                DVar5 = local_44;
                psVar1 = local_50;
                if (DVar4 == DVar3) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_300,(char *)psVar1,&local_301);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_328,"",&local_329);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_350,"/",&local_351);
                  core::IO::DefineAttribute<long>
                            (in_stack_ffffffffffffed88,
                             (string *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80)
                             ,(long *)in_stack_ffffffffffffed78,in_stack_ffffffffffffed70,
                             in_stack_ffffffffffffed68,
                             SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
                  std::__cxx11::string::~string(local_350);
                  std::allocator<char>::~allocator((allocator<char> *)&local_351);
                  std::__cxx11::string::~string(local_328);
                  std::allocator<char>::~allocator((allocator<char> *)&local_329);
                  std::__cxx11::string::~string(local_300);
                  std::allocator<char>::~allocator((allocator<char> *)&local_301);
                }
                else {
                  DVar3 = helper::GetDataType<unsigned_char>();
                  DVar4 = local_44;
                  psVar1 = local_50;
                  if (DVar5 == DVar3) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_378,(char *)psVar1,&local_379);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_3a0,"",&local_3a1);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_3c8,"/",&local_3c9);
                    core::IO::DefineAttribute<unsigned_char>
                              (in_stack_ffffffffffffed88,
                               (string *)
                               CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
                               (uchar *)in_stack_ffffffffffffed78,in_stack_ffffffffffffed70,
                               in_stack_ffffffffffffed68,
                               SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
                    std::__cxx11::string::~string(local_3c8);
                    std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
                    std::__cxx11::string::~string(local_3a0);
                    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
                    std::__cxx11::string::~string(local_378);
                    std::allocator<char>::~allocator((allocator<char> *)&local_379);
                  }
                  else {
                    DVar3 = helper::GetDataType<unsigned_short>();
                    DVar5 = local_44;
                    psVar1 = local_50;
                    if (DVar4 == DVar3) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_3f0,(char *)psVar1,&local_3f1);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_418,"",&local_419);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_440,"/",&local_441);
                      core::IO::DefineAttribute<unsigned_short>
                                (in_stack_ffffffffffffed88,
                                 (string *)
                                 CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
                                 (unsigned_short *)in_stack_ffffffffffffed78,
                                 in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,
                                 SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
                      std::__cxx11::string::~string(local_440);
                      std::allocator<char>::~allocator((allocator<char> *)&local_441);
                      std::__cxx11::string::~string(local_418);
                      std::allocator<char>::~allocator((allocator<char> *)&local_419);
                      std::__cxx11::string::~string(local_3f0);
                      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
                    }
                    else {
                      DVar3 = helper::GetDataType<unsigned_int>();
                      DVar4 = local_44;
                      psVar1 = local_50;
                      if (DVar5 == DVar3) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_468,(char *)psVar1,&local_469);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_490,"",&local_491);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_4b8,"/",&local_4b9);
                        core::IO::DefineAttribute<unsigned_int>
                                  (in_stack_ffffffffffffed88,
                                   (string *)
                                   CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
                                   (uint *)in_stack_ffffffffffffed78,in_stack_ffffffffffffed70,
                                   in_stack_ffffffffffffed68,
                                   SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
                        std::__cxx11::string::~string(local_4b8);
                        std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
                        std::__cxx11::string::~string(local_490);
                        std::allocator<char>::~allocator((allocator<char> *)&local_491);
                        std::__cxx11::string::~string(local_468);
                        std::allocator<char>::~allocator((allocator<char> *)&local_469);
                      }
                      else {
                        DVar3 = helper::GetDataType<unsigned_long>();
                        DVar5 = local_44;
                        psVar1 = local_50;
                        if (DVar4 == DVar3) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_4e0,(char *)psVar1,&local_4e1);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_508,"",&local_509);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_530,"/",&local_531);
                          core::IO::DefineAttribute<unsigned_long>
                                    (in_stack_ffffffffffffed88,
                                     (string *)
                                     CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
                                     (unsigned_long *)in_stack_ffffffffffffed78,
                                     in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,
                                     SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
                          std::__cxx11::string::~string(local_530);
                          std::allocator<char>::~allocator((allocator<char> *)&local_531);
                          std::__cxx11::string::~string(local_508);
                          std::allocator<char>::~allocator((allocator<char> *)&local_509);
                          std::__cxx11::string::~string(local_4e0);
                          std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
                        }
                        else {
                          DVar3 = helper::GetDataType<float>();
                          DVar4 = local_44;
                          psVar1 = local_50;
                          if (DVar5 == DVar3) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_558,(char *)psVar1,&local_559);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_580,"",&local_581);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_5a8,"/",&local_5a9);
                            core::IO::DefineAttribute<float>
                                      (in_stack_ffffffffffffed88,
                                       (string *)
                                       CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80)
                                       ,(float *)in_stack_ffffffffffffed78,in_stack_ffffffffffffed70
                                       ,in_stack_ffffffffffffed68,
                                       SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
                            std::__cxx11::string::~string(local_5a8);
                            std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
                            std::__cxx11::string::~string(local_580);
                            std::allocator<char>::~allocator((allocator<char> *)&local_581);
                            std::__cxx11::string::~string(local_558);
                            std::allocator<char>::~allocator((allocator<char> *)&local_559);
                          }
                          else {
                            DVar3 = helper::GetDataType<double>();
                            DVar5 = local_44;
                            psVar1 = local_50;
                            if (DVar4 == DVar3) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_5d0,(char *)psVar1,&local_5d1);
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_5f8,"",&local_5f9);
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_620,"/",&local_621);
                              core::IO::DefineAttribute<double>
                                        (in_stack_ffffffffffffed88,
                                         (string *)
                                         CONCAT44(in_stack_ffffffffffffed84,
                                                  in_stack_ffffffffffffed80),
                                         (double *)in_stack_ffffffffffffed78,
                                         in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,
                                         SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
                              std::__cxx11::string::~string(local_620);
                              std::allocator<char>::~allocator((allocator<char> *)&local_621);
                              std::__cxx11::string::~string(local_5f8);
                              std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
                              std::__cxx11::string::~string(local_5d0);
                              std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
                            }
                            else {
                              DVar4 = helper::GetDataType<long_double>();
                              psVar1 = local_50;
                              if (DVar5 == DVar4) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_648,(char *)psVar1,&local_649);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_670,"",&local_671);
                                in_stack_ffffffffffffed88 = (IO *)local_699;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          ((string *)(local_699 + 1),"/",
                                           (allocator *)in_stack_ffffffffffffed88);
                                core::IO::DefineAttribute<long_double>
                                          (in_stack_ffffffffffffed88,
                                           (string *)
                                           CONCAT44(in_stack_ffffffffffffed84,
                                                    in_stack_ffffffffffffed80),
                                           (longdouble *)in_stack_ffffffffffffed78,
                                           in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,
                                           SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
                                std::__cxx11::string::~string((string *)(local_699 + 1));
                                std::allocator<char>::~allocator((allocator<char> *)local_699);
                                std::__cxx11::string::~string(local_670);
                                std::allocator<char>::~allocator((allocator<char> *)&local_671);
                                std::__cxx11::string::~string(local_648);
                                std::allocator<char>::~allocator((allocator<char> *)&local_649);
                              }
                              else {
                                in_stack_ffffffffffffed84 = local_44;
                                DVar4 = helper::GetDataType<std::complex<float>>();
                                DVar5 = local_44;
                                if (in_stack_ffffffffffffed84 == DVar4) {
                                  in_stack_ffffffffffffed68 =
                                       *(string **)(*(long *)(in_RDI + 0x10) + 0x28);
                                  in_stack_ffffffffffffed78 =
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_6c1;
                                  in_stack_ffffffffffffed70 = local_50;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)(local_6c1 + 1),
                                             (char *)in_stack_ffffffffffffed70,
                                             (allocator *)in_stack_ffffffffffffed78);
                                  in_stack_ffffffffffffed60 = (string *)local_6e9;
                                  in_stack_ffffffffffffed58 = local_40;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)(local_6e9 + 1),"",
                                             (allocator *)in_stack_ffffffffffffed60);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_710,"/",&local_711);
                                  core::IO::DefineAttribute<std::complex<float>>
                                            (in_stack_ffffffffffffed88,
                                             (string *)
                                             CONCAT44(in_stack_ffffffffffffed84,
                                                      in_stack_ffffffffffffed80),
                                             (complex<float> *)in_stack_ffffffffffffed78,
                                             in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,
                                             SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
                                  std::__cxx11::string::~string(local_710);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_711);
                                  std::__cxx11::string::~string((string *)(local_6e9 + 1));
                                  std::allocator<char>::~allocator((allocator<char> *)local_6e9);
                                  std::__cxx11::string::~string((string *)(local_6c1 + 1));
                                  std::allocator<char>::~allocator((allocator<char> *)local_6c1);
                                }
                                else {
                                  DVar4 = helper::GetDataType<std::complex<double>>();
                                  psVar1 = local_50;
                                  if (DVar5 == DVar4) {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              (local_738,(char *)psVar1,&local_739);
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string(local_760,"",&local_761);
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string(local_788,"/",&local_789);
                                    core::IO::DefineAttribute<std::complex<double>>
                                              (in_stack_ffffffffffffed88,
                                               (string *)
                                               CONCAT44(in_stack_ffffffffffffed84,
                                                        in_stack_ffffffffffffed80),
                                               (complex<double> *)in_stack_ffffffffffffed78,
                                               in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,
                                               SUB81((ulong)in_stack_ffffffffffffed60 >> 0x38,0));
                                    std::__cxx11::string::~string(local_788);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_789);
                                    std::__cxx11::string::~string(local_760);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_761);
                                    std::__cxx11::string::~string(local_738);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_739);
                                  }
                                  else {
                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                             "Loading attribute matched no type ");
                                    ToString_abi_cxx11_((DataType)
                                                        ((ulong)in_stack_ffffffffffffe9b8 >> 0x20));
                                    poVar7 = std::operator<<(poVar7,local_7b0);
                                    std::ostream::operator<<
                                              (poVar7,std::endl<char,std::char_traits<char>>);
                                    std::__cxx11::string::~string(local_7b0);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void BP5Deserializer::InstallAttributesV1(FFSTypeHandle FFSformat, void *BaseData, size_t Step)
{
    FMFieldList FieldList;
    FMStructDescList FormatList;

    if (Step != m_LastAttrStep)
    {
        m_Engine->m_IO.RemoveAllAttributes();
        m_LastAttrStep = Step;
    }
    FormatList = format_list_of_FMFormat(FMFormat_of_original(FFSformat));
    FieldList = FormatList[0].field_list;
    int i = 0;
    while (FieldList[i].field_name)
    {
        void *field_data = (char *)BaseData + FieldList[i].field_offset;

        if (!NameIndicatesAttrArray(FieldList[i].field_name))
        {
            DataType Type;
            int ElemSize;
            const char *FieldName = BreakdownVarName(FieldList[i].field_name, &Type, &ElemSize);
            if (Type == adios2::DataType::Struct)
            {
                return;
            }
            else if (Type == helper::GetDataType<std::string>())
            {
                m_Engine->m_IO.DefineAttribute<std::string>(FieldName, *(char **)field_data, "",
                                                            "/", true);
            }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        m_Engine->m_IO.DefineAttribute<T>(FieldName, *(T *)field_data, "", "/", true);             \
    }

            ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
            else
            {
                std::cout << "Loading attribute matched no type " << ToString(Type) << std::endl;
            }
            i++;
        }
        else
        {
            DataType Type;
            size_t ElemCount = *(size_t *)field_data;
            field_data = (void *)((char *)field_data + sizeof(size_t));
            i++;
            char *FieldName = strdup(FieldList[i].field_name + 4); // skip BP5_
            char *FieldType = strdup(FieldList[i].field_type);
            *strchr(FieldType, '[') = 0;
            Type = (DataType)TranslateFFSType2ADIOS(FieldType, FieldList[i].field_size);
            if (Type == adios2::DataType::Struct)
            {
                return;
            }
            else if (Type == helper::GetDataType<std::string>())
            {
                std::vector<std::string> array;
                array.resize(ElemCount);
                char **str_array = *(char ***)field_data;
                for (size_t i = 0; i < ElemCount; i++)
                {
                    array[i].assign(str_array[i]);
                }
                m_Engine->m_IO.DefineAttribute<std::string>(FieldName, array.data(), array.size(),
                                                            "", "/", true);
            }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        T **array = *(T ***)field_data;                                                            \
        m_Engine->m_IO.DefineAttribute<T>(FieldName, (T *)array, ElemCount, "", "/", true);        \
    }

            ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
            else
            {
                std::cout << "Loading attribute matched no type " << ToString(Type) << std::endl;
            }